

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaExporter::WriteImageEntry(ColladaExporter *this,Surface *pSurface,string *pNameAdd)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  reference pcVar4;
  void *pvVar5;
  byte *pbVar6;
  string local_228;
  string local_208;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  const_iterator it;
  stringstream imageUrlEncoded;
  ostream local_1c8 [392];
  string local_40;
  string *local_20;
  string *pNameAdd_local;
  Surface *pSurface_local;
  ColladaExporter *this_local;
  
  local_20 = pNameAdd;
  pNameAdd_local = (string *)pSurface;
  pSurface_local = (Surface *)this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar3 = std::operator<<(poVar3,"<image id=\"");
    XMLEscape(&local_40,local_20);
    poVar3 = std::operator<<(poVar3,(string *)&local_40);
    poVar3 = std::operator<<(poVar3,"\">");
    std::operator<<(poVar3,(string *)&this->endstr);
    std::__cxx11::string::~string((string *)&local_40);
    PushTag(this);
    poVar3 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    std::operator<<(poVar3,"<init_from>");
    std::__cxx11::stringstream::stringstream((stringstream *)&it);
    local_1e0._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      local_1e8._M_current = (char *)std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator!=(&local_1e0,&local_1e8);
      if (!bVar1) break;
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_1e0);
      bVar1 = isalnum_C(*pcVar4);
      if (bVar1) {
LAB_00452621:
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_1e0);
        std::operator<<(local_1c8,*pcVar4);
      }
      else {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_1e0);
        if (*pcVar4 == ':') goto LAB_00452621;
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_1e0);
        if (*pcVar4 == '_') goto LAB_00452621;
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_1e0);
        if (*pcVar4 == '-') goto LAB_00452621;
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_1e0);
        if (*pcVar4 == '.') goto LAB_00452621;
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_1e0);
        if (*pcVar4 == '/') goto LAB_00452621;
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_1e0);
        if (*pcVar4 == '\\') goto LAB_00452621;
        poVar3 = std::operator<<(local_1c8,'%');
        pvVar5 = (void *)std::ostream::operator<<(poVar3,std::hex);
        pbVar6 = (byte *)__gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_1e0);
        pvVar5 = (void *)std::ostream::operator<<(pvVar5,(ulong)*pbVar6);
        std::ostream::operator<<(pvVar5,std::dec);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_1e0);
    }
    std::__cxx11::stringstream::str();
    XMLEscape(&local_208,&local_228);
    std::operator<<((ostream *)&this->field_0x38,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    poVar3 = std::operator<<((ostream *)&this->field_0x38,"</init_from>");
    std::operator<<(poVar3,(string *)&this->endstr);
    PopTag(this);
    poVar3 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar3 = std::operator<<(poVar3,"</image>");
    std::operator<<(poVar3,(string *)&this->endstr);
    std::__cxx11::stringstream::~stringstream((stringstream *)&it);
  }
  return;
}

Assistant:

void ColladaExporter::WriteImageEntry( const Surface& pSurface, const std::string& pNameAdd) {
  if( !pSurface.texture.empty() )
  {
    mOutput << startstr << "<image id=\"" << XMLEscape(pNameAdd) << "\">" << endstr;
    PushTag();
    mOutput << startstr << "<init_from>";

    // URL encode image file name first, then XML encode on top
    std::stringstream imageUrlEncoded;
    for( std::string::const_iterator it = pSurface.texture.begin(); it != pSurface.texture.end(); ++it )
    {
      if( isalnum_C( (unsigned char) *it) || *it == ':' || *it == '_' || *it == '-' || *it == '.' || *it == '/' || *it == '\\' )
        imageUrlEncoded << *it;
      else
        imageUrlEncoded << '%' << std::hex << size_t( (unsigned char) *it) << std::dec;
    }
    mOutput << XMLEscape(imageUrlEncoded.str());
    mOutput << "</init_from>" << endstr;
    PopTag();
    mOutput << startstr << "</image>" << endstr;
  }
}